

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

void __thiscall
spoa::SisdAlignmentEngine::Prealloc
          (SisdAlignmentEngine *this,uint32_t max_sequence_len,uint8_t alphabet_size)

{
  uint uVar1;
  invalid_argument *this_00;
  bad_alloc *ba;
  uint8_t alphabet_size_local;
  uint32_t max_sequence_len_local;
  SisdAlignmentEngine *this_local;
  
  uVar1 = std::numeric_limits<int>::max();
  if (uVar1 < max_sequence_len) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::SisdAlignmentEngine::Prealloc] error: too large sequence!");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Realloc(this,(ulong)max_sequence_len + 1,
          (ulong)max_sequence_len * (ulong)alphabet_size + (ulong)alphabet_size,alphabet_size);
  return;
}

Assistant:

void SisdAlignmentEngine::Prealloc(
    std::uint32_t max_sequence_len,
    std::uint8_t alphabet_size) {
  if (max_sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Prealloc] error: too large sequence!");
  }
  try {
    Realloc(
        static_cast<std::uint64_t>(max_sequence_len) + 1,
        static_cast<std::uint64_t>(max_sequence_len) * alphabet_size + alphabet_size,  // NOLINT
        alphabet_size);
  } catch (std::bad_alloc& ba) {
    throw std::invalid_argument(
        "[spoa::SisdAlignmentEngine::Prealloc] error: insufficient memory!");
  }
}